

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# append_truncated.h
# Opt level: O2

size_t __thiscall
absl::lts_20250127::log_internal::AppendTruncated
          (log_internal *this,string_view src,Span<char> *dst)

{
  Span<char> *this_00;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  
  this_00 = (Span<char> *)src._M_str;
  local_20._M_str = (char *)src._M_len;
  local_20._M_len = (size_t)this;
  if ((log_internal *)this_00->len_ < this) {
    local_20 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                         (&local_20,0,this_00->len_);
  }
  memcpy(this_00->ptr_,local_20._M_str,local_20._M_len);
  Span<char>::remove_prefix(this_00,local_20._M_len);
  return local_20._M_len;
}

Assistant:

inline size_t AppendTruncated(absl::string_view src, absl::Span<char> &dst) {
  if (src.size() > dst.size()) src = src.substr(0, dst.size());
  memcpy(dst.data(), src.data(), src.size());
  dst.remove_prefix(src.size());
  return src.size();
}